

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O1

unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
 __thiscall
Enhedron::Test::Impl::Impl_Suite::
context<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>
          (Impl_Suite *this,string *name,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_1,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_2,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_3,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_4,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_5,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_6,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_7,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_8,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_9,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_10,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_11,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_12)

{
  pointer pcVar1;
  undefined8 *puVar2;
  ContextList contextList;
  _Head_base<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_false> local_60;
  vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  local_58;
  vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  local_38;
  
  local_58.
  super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60._M_head_impl =
       (childContextList->_M_t).
       super___uniq_ptr_impl<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
       ._M_t.
       super__Tuple_impl<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
       .super__Head_base<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_false>._M_head_impl;
  (childContextList->_M_t).
  super___uniq_ptr_impl<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  ._M_t.
  super__Tuple_impl<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  .super__Head_base<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_false>._M_head_impl =
       (Context *)0x0;
  makeContextList<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>
            (&local_58,
             (unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
              *)&local_60,childContextList_1,childContextList_2,childContextList_3,
             childContextList_4,childContextList_5,childContextList_6,childContextList_7,
             childContextList_8,childContextList_9,childContextList_10,childContextList_11,
             childContextList_12);
  if (local_60._M_head_impl != (Context *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Context[1])();
  }
  local_60._M_head_impl = (Context *)0x0;
  puVar2 = (undefined8 *)operator_new(0x40);
  local_38.
  super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *puVar2 = &PTR__NodeContext_0016ecc8;
  puVar2[1] = puVar2 + 3;
  pcVar1 = (name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 1),pcVar1,pcVar1 + name->_M_string_length);
  puVar2[5] = local_38.
              super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  puVar2[6] = local_38.
              super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  puVar2[7] = local_38.
              super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.
  super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ::~vector(&local_38);
  *(undefined8 **)this = puVar2;
  std::
  vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ::~vector(&local_58);
  return (__uniq_ptr_data<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>,_true,_true>
          )(__uniq_ptr_data<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>,_true,_true>
            )this;
}

Assistant:

unique_ptr<Context> context(const string& name, ContextListType&&... childContextList) {
        ContextList contextList;
        makeContextList(out(contextList), forward<ContextListType>(childContextList)...);

        return make_unique<NodeContext>(name, move(contextList));
    }